

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_instsv.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  dlog_mt_install_params_t *instsv_table;
  FILE *pFVar3;
  size_t sVar4;
  char *__format;
  
  if (argc < 2) {
    printf("Usage:\n\tmm_instsv mm_table_%02x.bin [outputfile.bin]\n",0x1f);
    return -1;
  }
  pcVar2 = table_to_string('\x1f');
  printf("Nortel Millennium %s Table %d (0x%02x) Dump\n\n",pcVar2,0x1f,0x1f);
  instsv_table = (dlog_mt_install_params_t *)calloc(1,0x25);
  if (instsv_table == (dlog_mt_install_params_t *)0x0) {
    printf("Failed to allocate %zu bytes.\n",0x25);
    return -0xc;
  }
  pFVar3 = fopen(argv[1],"rb");
  if (pFVar3 == (FILE *)0x0) {
    pcVar2 = argv[1];
    __format = "Error opening %s\n";
LAB_0010438e:
    printf(__format,pcVar2);
    free(instsv_table);
    iVar1 = -2;
  }
  else {
    iVar1 = mm_validate_table_fsize('\x1f',(FILE *)pFVar3,0x24);
    if (iVar1 == 0) {
      sVar4 = fread(instsv_table->access_code,0x24,1,pFVar3);
      if (sVar4 == 1) {
        fclose(pFVar3);
        print_instsv_table(instsv_table);
        instsv_table->coin_service_flags = '\x01';
        iVar1 = 0;
        if (argc == 2) {
LAB_00104364:
          free(instsv_table);
          return iVar1;
        }
        pFVar3 = fopen(argv[2],"wb");
        pcVar2 = argv[2];
        if (pFVar3 != (FILE *)0x0) {
          iVar1 = 0;
          printf("\nWriting new table to %s\n",pcVar2);
          sVar4 = fwrite(instsv_table->access_code,0x24,1,pFVar3);
          if (sVar4 != 1) {
            printf("Error writing output file %s\n",argv[2]);
            iVar1 = -5;
          }
          fclose(pFVar3);
          goto LAB_00104364;
        }
        __format = "Error opening output file %s for write.\n";
        goto LAB_0010438e;
      }
      pcVar2 = table_to_string('\x1f');
      printf("Error reading %s table.\n",pcVar2);
    }
    free(instsv_table);
    fclose(pFVar3);
    iVar1 = -5;
  }
  return iVar1;
}

Assistant:

int main(int argc, char *argv[]) {
    FILE *instream;
    FILE *ostream = NULL;
    dlog_mt_install_params_t *instsv_table;
    uint8_t* load_buffer;
    int  ret = 0;

    if (argc <= 1) {
        printf("Usage:\n" \
               "\tmm_instsv mm_table_%02x.bin [outputfile.bin]\n", TABLE_ID);
        return -1;
    }

    printf("Nortel Millennium %s Table %d (0x%02x) Dump\n\n", table_to_string(TABLE_ID), TABLE_ID, TABLE_ID);

    instsv_table = (dlog_mt_install_params_t *)calloc(1, sizeof(dlog_mt_install_params_t));

    if (instsv_table == NULL) {
        printf("Failed to allocate %zu bytes.\n", sizeof(dlog_mt_install_params_t));
        return -ENOMEM;
    }

    if ((instream = fopen(argv[1], "rb")) == NULL) {
        printf("Error opening %s\n", argv[1]);
        free(instsv_table);
        return -ENOENT;
    }

    if (mm_validate_table_fsize(TABLE_ID, instream, sizeof(dlog_mt_install_params_t) - 1) != 0) {
        free(instsv_table);
        fclose(instream);
        return -EIO;
    }

    load_buffer = ((uint8_t*)instsv_table) + 1;
    if (fread(load_buffer, sizeof(dlog_mt_install_params_t) - 1, 1, instream) != 1) {
        printf("Error reading %s table.\n", table_to_string(TABLE_ID));
        free(instsv_table);
        fclose(instream);
        return -EIO;
    }

    fclose(instream);

    print_instsv_table(instsv_table);

    /* Modify INSTSV table */
    instsv_table->coin_service_flags = INSTSV_CASHBOX_QUERY_MENU_ENABLE;

    if (argc > 2) {
        if ((ostream = fopen(argv[2], "wb")) == NULL) {
            printf("Error opening output file %s for write.\n", argv[2]);
            free(instsv_table);
            return -ENOENT;
        }
    }

    /* If output file was specified, write it. */
    if (ostream != NULL) {
        printf("\nWriting new table to %s\n", argv[2]);

        if (fwrite(load_buffer, sizeof(dlog_mt_install_params_t) - 1, 1, ostream) != 1) {
            printf("Error writing output file %s\n", argv[2]);
            ret = -EIO;
        }
        fclose(ostream);
    }

    if (instsv_table != NULL) {
        free(instsv_table);
    }

    return ret;
}